

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall
wabt::interp::Trap::Trap
          (Trap *this,Store *store,string *msg,
          vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *trace)

{
  (this->super_Object).kind_ = Trap;
  *(undefined8 *)&(this->super_Object).finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Object).finalizer_.super__Function_base._M_functor + 8) = 0;
  (this->super_Object).finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Object).finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Object).host_info_ = (void *)0x0;
  (this->super_Object).self_.index = 0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Trap_001f0670;
  std::__cxx11::string::string((string *)&this->message_,(string *)msg);
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
            (&this->trace_,trace);
  return;
}

Assistant:

Trap::Trap(Store& store,
           const std::string& msg,
           const std::vector<Frame>& trace)
    : Object(skind), message_(msg), trace_(trace) {}